

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_phys(spng_ctx *ctx,spng_phys *phys)

{
  undefined1 *puVar1;
  undefined3 uVar2;
  uint32_t uVar3;
  int iVar4;
  
  iVar4 = 1;
  if (((phys != (spng_phys *)0x0 && ctx != (spng_ctx *)0x0) &&
      (((ctx->data != (uchar *)0x0 || (iVar4 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
       (iVar4 = read_chunks(ctx,0), iVar4 == 0)))) &&
     (((iVar4 = 0x37, phys->unit_specifier < 2 && (-1 < (int)phys->ppu_x)) &&
      (-1 < (int)phys->ppu_y)))) {
    uVar2 = *(undefined3 *)&phys->field_0x9;
    (ctx->phys).unit_specifier = phys->unit_specifier;
    *(undefined3 *)&(ctx->phys).field_0x9 = uVar2;
    uVar3 = phys->ppu_y;
    (ctx->phys).ppu_x = phys->ppu_x;
    (ctx->phys).ppu_y = uVar3;
    puVar1 = &(ctx->stored).field_0x1;
    *puVar1 = *puVar1 | 8;
    puVar1 = &(ctx->user).field_0x1;
    *puVar1 = *puVar1 | 8;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int spng_set_phys(spng_ctx *ctx, struct spng_phys *phys)
{
    SPNG_SET_CHUNK_BOILERPLATE(phys);

    if(check_phys(phys)) return SPNG_EPHYS;

    ctx->phys = *phys;

    ctx->stored.phys = 1;
    ctx->user.phys = 1;

    return 0;
}